

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

file_flags_t libtorrent::anon_unknown_1::get_file_attributes(bdecode_node *dict)

{
  undefined8 this;
  bool bVar1;
  const_iterator pvVar2;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  string_view local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  string_view *__range3;
  undefined1 local_58 [8];
  bdecode_node attr;
  bdecode_node *dict_local;
  file_flags_t file_flags;
  
  attr._56_8_ = dict;
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::bitfield_flag
            ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> *)
             ((long)&dict_local + 7));
  this = attr._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"attr");
  bdecode_node::dict_find_string((bdecode_node *)local_58,(bdecode_node *)this,___range3);
  bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar1) {
    local_80 = bdecode_node::string_value((bdecode_node *)local_58);
    local_70 = &local_80;
    __end3 = ::std::basic_string_view<char,_std::char_traits<char>_>::begin(local_70);
    pvVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::end(local_70);
    for (; __end3 != pvVar2; __end3 = __end3 + 1) {
      switch(*__end3) {
      case 'h':
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::
        operator|=((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> *)
                   ((long)&dict_local + 7),
                   (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\x02');
        break;
      case 'l':
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::
        operator|=((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> *)
                   ((long)&dict_local + 7),
                   (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\b');
        break;
      case 'p':
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::
        operator|=((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> *)
                   ((long)&dict_local + 7),
                   (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\x01');
        break;
      case 'x':
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::
        operator|=((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> *)
                   ((long)&dict_local + 7),
                   (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\x04');
      }
    }
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_58);
  return (file_flags_t)dict_local._7_1_;
}

Assistant:

file_flags_t get_file_attributes(bdecode_node const& dict)
	{
		file_flags_t file_flags = {};
		bdecode_node const attr = dict.dict_find_string("attr");
		if (attr)
		{
			for (char const c : attr.string_value())
			{
				switch (c)
				{
					case 'l': file_flags |= file_storage::flag_symlink; break;
					case 'x': file_flags |= file_storage::flag_executable; break;
					case 'h': file_flags |= file_storage::flag_hidden; break;
					case 'p': file_flags |= file_storage::flag_pad_file; break;
				}
			}
		}
		return file_flags;
	}